

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_activate_search(ps_decoder_t *ps,char *name)

{
  uint8 uVar1;
  int iVar2;
  char *name_00;
  ps_search_t *ppVar3;
  long lVar4;
  
  uVar1 = ps->acmod->state;
  if ((uVar1 == '\0') || (uVar1 == '\x03')) {
    name_00 = "_default";
    if (name != (char *)0x0) {
      name_00 = name;
    }
    ppVar3 = ps_find_search(ps,name_00);
    if (ppVar3 != (ps_search_t *)0x0) {
      ps->search = ppVar3;
      iVar2 = strcmp("ngram",ppVar3->type);
      if (iVar2 == 0) {
        lVar4 = ps_config_int(ps->config,"pl_window");
        ps->pl_window = (int)lVar4;
      }
      else {
        ps->pl_window = 0;
      }
      return 0;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x1f7,"Cannot change search while decoding, end utterance first\n");
  }
  return -1;
}

Assistant:

int
ps_activate_search(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search;

    if (ps->acmod->state != ACMOD_ENDED && ps->acmod->state != ACMOD_IDLE) {
        E_ERROR("Cannot change search while decoding, end utterance first\n");
        return -1;
    }

    if (name == NULL)
        name = PS_DEFAULT_SEARCH;

    if (!(search = ps_find_search(ps, name)))
        return -1;

    ps->search = search;
    /* Set pl window depending on the search */
    if (!strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search))) {
        ps->pl_window = ps_config_int(ps->config, "pl_window");
    } else {
        ps->pl_window = 0;
    }

    return 0;
}